

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_str.c
# Opt level: O1

char * ck_strdup_printf(char *fmt,...)

{
  bool bVar1;
  char in_AL;
  int iVar2;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  char *unaff_R13;
  char *pcVar3;
  size_t __maxlen;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  __maxlen = 100;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  __s = (char *)emalloc(100);
  do {
    local_f8 = local_e8;
    local_100 = &ap[0].overflow_arg_area;
    local_108 = 0x3000000008;
    iVar2 = vsnprintf(__s,__maxlen,fmt,&local_108);
    bVar1 = (int)__maxlen <= iVar2;
    pcVar3 = __s;
    if (bVar1 || iVar2 < 0) {
      __maxlen = __maxlen * 2;
      if (-1 < iVar2) {
        __maxlen = (ulong)(iVar2 + 1);
      }
      __s = (char *)erealloc(__s,__maxlen);
      pcVar3 = unaff_R13;
    }
    unaff_R13 = pcVar3;
  } while (bVar1 || iVar2 < 0);
  return pcVar3;
}

Assistant:

char *ck_strdup_printf(const char *fmt, ...)
{
    /* Guess we need no more than 100 bytes. */
    size_t size = 100;
    char *p;
    va_list ap;

    p = (char *)emalloc(size);

    while(1)
    {
        int n;
        /* Try to print in the allocated space. */
        va_start(ap, fmt);
        n = vsnprintf(p, size, fmt, ap);
        va_end(ap);
        /* If that worked, return the string. */
        if(n > -1 && n < (int)size)
            return p;

        /* Else try again with more space. */
        if(n > -1)              /* C99 conform vsnprintf() */
            size = (size_t) n + 1;      /* precisely what is needed */
        else                    /* glibc 2.0 */
            size *= 2;          /* twice the old size */

        p = (char *)erealloc(p, size);
    }
}